

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

int __thiscall jbcoin::Serializer::addEncoded(Serializer *this,int length)

{
  uint uVar1;
  value_type_conflict vVar2;
  int iVar3;
  reference pvVar4;
  int local_1c;
  array<unsigned_char,_4UL> local_18;
  int numBytes;
  array<unsigned_char,_4UL> bytes;
  int length_local;
  Serializer *this_local;
  
  numBytes = length;
  _bytes = this;
  if (length < 0xc1) {
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,0);
    *pvVar4 = (value_type_conflict)length;
    local_1c = 1;
  }
  else if (length < 0x30c1) {
    numBytes = length + -0xc1;
    uVar1 = (uint)numBytes >> 8;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,0);
    *pvVar4 = (char)uVar1 + 0xc1;
    vVar2 = (value_type_conflict)numBytes;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,1);
    *pvVar4 = vVar2;
    local_1c = 2;
  }
  else {
    if (0xe04d8 < length) {
      Throw<std::overflow_error,char_const(&)[7]>((char (*) [7])"lenlen");
    }
    numBytes = length + -0x30c1;
    uVar1 = (uint)numBytes >> 0x10;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,0);
    *pvVar4 = (char)uVar1 + 0xf1;
    uVar1 = (uint)numBytes >> 8;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,1);
    *pvVar4 = (value_type_conflict)uVar1;
    vVar2 = (value_type_conflict)numBytes;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,2);
    *pvVar4 = vVar2;
    local_1c = 3;
  }
  pvVar4 = std::array<unsigned_char,_4UL>::operator[](&local_18,0);
  iVar3 = addRaw(this,pvVar4,local_1c);
  return iVar3;
}

Assistant:

int Serializer::addEncoded (int length)
{
    std::array<std::uint8_t, 4> bytes;
    int numBytes = 0;

    if (length <= 192)
    {
        bytes[0] = static_cast<unsigned char> (length);
        numBytes = 1;
    }
    else if (length <= 12480)
    {
        length -= 193;
        bytes[0] = 193 + static_cast<unsigned char> (length >> 8);
        bytes[1] = static_cast<unsigned char> (length & 0xff);
        numBytes = 2;
    }
    else if (length <= 918744)
    {
        length -= 12481;
        bytes[0] = 241 + static_cast<unsigned char> (length >> 16);
        bytes[1] = static_cast<unsigned char> ((length >> 8) & 0xff);
        bytes[2] = static_cast<unsigned char> (length & 0xff);
        numBytes = 3;
    }
    else Throw<std::overflow_error> ("lenlen");

    return addRaw (&bytes[0], numBytes);
}